

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

char * xmrig::backend_tag(uint32_t backend)

{
  int in_EDI;
  undefined8 local_8;
  
  if (in_EDI == 1) {
    local_8 = ocl_tag();
  }
  else if (in_EDI == 2) {
    local_8 = cuda_tag();
  }
  else {
    local_8 = tag;
  }
  return local_8;
}

Assistant:

const char *xmrig::backend_tag(uint32_t backend)
{
#   ifdef XMRIG_FEATURE_OPENCL
    if (backend == Nonce::OPENCL) {
        return ocl_tag();
    }
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    if (backend == Nonce::CUDA) {
        return cuda_tag();
    }
#   endif

    return tag;
}